

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandlineflags.cc
# Opt level: O0

bool benchmark::ParseDouble(string *src_text,char *str,double *value)

{
  char cVar1;
  ostream *poVar2;
  double dVar3;
  double double_value;
  char *end;
  double *value_local;
  char *str_local;
  string *src_text_local;
  
  double_value = 0.0;
  end = (char *)value;
  value_local = (double *)str;
  str_local = (char *)src_text;
  dVar3 = strtod(str,(char **)&double_value);
  cVar1 = *(char *)double_value;
  if (cVar1 == '\0') {
    *(double *)end = dVar3;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)str_local);
    poVar2 = std::operator<<(poVar2," is expected to be a double, ");
    poVar2 = std::operator<<(poVar2,"but actually has value \"");
    poVar2 = std::operator<<(poVar2,(char *)value_local);
    std::operator<<(poVar2,"\".\n");
  }
  return cVar1 == '\0';
}

Assistant:

bool ParseDouble(const std::string& src_text, const char* str, double* value) {
  // Parses the environment variable as a decimal integer.
  char* end = nullptr;
  const double double_value = strtod(str, &end);  // NOLINT

  // Has strtol() consumed all characters in the string?
  if (*end != '\0') {
    // No - an invalid character was encountered.
    std::cerr << src_text << " is expected to be a double, "
              << "but actually has value \"" << str << "\".\n";
    return false;
  }

  *value = double_value;
  return true;
}